

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O2

void DukValue::free_ref(duk_context *ctx,duk_uarridx_t ref_array_idx)

{
  push_ref_array(ctx);
  duk_get_prop_index(ctx,-1,0);
  duk_put_prop_index(ctx,-2,ref_array_idx);
  duk_push_uint(ctx,ref_array_idx);
  duk_put_prop_index(ctx,-2,0);
  duk_pop(ctx);
  return;
}

Assistant:

static void free_ref(duk_context* ctx, duk_uarridx_t ref_array_idx)
	{
		push_ref_array(ctx);

		// add this spot to the free list
		// refs[old_obj_idx] = refs[0] (implicitly gives up our reference)
		duk_get_prop_index(ctx, -1, 0);
		duk_put_prop_index(ctx, -2, ref_array_idx);

		// refs[0] = old_obj_idx
		duk_push_uint(ctx, ref_array_idx);
		duk_put_prop_index(ctx, -2, 0);

		duk_pop(ctx);  // pop ref array
	}